

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rest_rpc::req_result::as<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,req_result *this)

{
  const_pointer pcVar1;
  logic_error *this_00;
  size_type sVar2;
  pointer *__ptr_2;
  pointer *__ptr;
  string_view result;
  string err_msg;
  undefined1 local_68 [40];
  undefined1 local_40 [24];
  _Head_base<0UL,_msgpack::v1::zone_*,_false> local_28;
  
  sVar2 = (this->data_)._M_string_length;
  if (sVar2 != 0) {
    local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    local_68._24_8_ = (zone *)0x0;
    rpc_service::msgpack_codec::unpack<std::tuple<int>>
              ((msgpack_codec *)local_40,local_68,(size_t)(this->data_)._M_dataplus._M_p);
    if ((zone *)local_68._24_8_ != (zone *)0x0) {
      std::default_delete<msgpack::v1::zone>::operator()
                ((default_delete<msgpack::v1::zone> *)(local_68 + 0x18),(zone *)local_68._24_8_);
    }
    if (local_40._0_4_ == NIL) {
      local_40._0_4_ = NIL;
      local_28._M_head_impl = (zone *)0x0;
      rpc_service::msgpack_codec::unpack<std::tuple<int,std::__cxx11::string>>
                ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_68,(msgpack_codec *)local_40,(this->data_)._M_dataplus._M_p,
                 (this->data_)._M_string_length);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_68._0_8_,
                 (pointer)(local_68._0_8_ + local_68._8_8_));
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_);
      }
      if (local_28._M_head_impl != (zone *)0x0) {
        std::default_delete<msgpack::v1::zone>::operator()
                  ((default_delete<msgpack::v1::zone> *)&local_28,local_28._M_head_impl);
      }
      return __return_storage_ptr__;
    }
    pcVar1 = (const_pointer)(this->data_)._M_string_length;
    if (pcVar1 != (const_pointer)0x0) {
      result.size_ = sVar2;
      result.data_ = pcVar1;
      get_error_msg_abi_cxx11_((string *)local_68,(rest_rpc *)(this->data_)._M_dataplus._M_p,result)
      ;
      goto LAB_0017fa08;
    }
  }
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,(this->data_)._M_dataplus._M_p);
LAB_0017fa08:
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)local_68);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T as() {
    if (has_error(data_)) {
      std::string err_msg = data_.empty() ? data_ : get_error_msg(data_);
      throw std::logic_error(err_msg);
    }

    return get_result<T>(data_);
  }